

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_suite.cpp
# Opt level: O0

void string_suite::test_escape_tab(void)

{
  string local_1e8 [36];
  undefined4 local_1c4;
  size_type local_1c0 [3];
  undefined1 local_1a8 [8];
  encoder_type encoder;
  ostringstream local_180 [8];
  ostringstream result;
  
  std::__cxx11::ostringstream::ostringstream(local_180);
  trial::protocol::json::detail::basic_encoder<char,24ul>::
  basic_encoder<std::__cxx11::ostringstream>
            ((basic_encoder<char,24ul> *)local_1a8,
             (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180);
  local_1c0[0] = trial::protocol::json::detail::basic_encoder<char,_24UL>::value
                           ((basic_encoder<char,_24UL> *)local_1a8,"\t");
  local_1c4 = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("encoder.value(\"\\t\")","4",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,0x28d,"void string_suite::test_escape_tab()",local_1c0,&local_1c4);
  std::__cxx11::ostringstream::str();
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[5]>
            ("result.str()","\"\\\"\\\\t\\\"\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,0x28e,"void string_suite::test_escape_tab()",local_1e8,"\"\\t\"");
  std::__cxx11::string::~string(local_1e8);
  trial::protocol::json::detail::basic_encoder<char,_24UL>::~basic_encoder
            ((basic_encoder<char,_24UL> *)local_1a8);
  std::__cxx11::ostringstream::~ostringstream(local_180);
  return;
}

Assistant:

void test_escape_tab()
{
    std::ostringstream result;
    encoder_type encoder(result);
    TRIAL_PROTOCOL_TEST_EQUAL(encoder.value("\t"), 4);
    TRIAL_PROTOCOL_TEST_EQUAL(result.str(), "\"\\t\"");
}